

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  uv_write_t *req;
  void *pvVar2;
  undefined8 *extraout_RDX;
  uint nbufs;
  undefined8 *__size;
  char *base;
  long lVar3;
  uv_buf_t uVar4;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_88;
  long local_80;
  uv_buf_t local_78 [5];
  
  __size = &local_88;
  if (pinger->vectored_writes == 0) {
    local_78[0] = uv_buf_init(PING,5);
    nbufs = 1;
  }
  else {
    base = PING;
    lVar3 = 8;
    do {
      uVar4 = uv_buf_init(base,1);
      *(char **)((long)local_78 + lVar3 + -8) = uVar4.base;
      *(size_t *)((long)&local_78[0].base + lVar3) = uVar4.len;
      base = base + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x58);
    nbufs = 5;
  }
  req = (uv_write_t *)malloc(200);
  if (req == (uv_write_t *)0x0) {
    pinger_write_ping_cold_2();
  }
  else {
    req->data = (void *)0x0;
    iVar1 = uv_write(req,(uv_stream_t *)&(pinger->stream).tcp,local_78,nbufs,pinger_after_write);
    local_80 = (long)iVar1;
    local_88 = 0;
    if (local_80 == 0) {
      puts("PING");
      return;
    }
  }
  pinger_write_ping_cold_1();
  pvVar2 = malloc((size_t)__size);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_stream_t* stream;
  uv_write_t* req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  stream = (uv_stream_t*) &pinger->stream.tcp;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  req->data = NULL;
  ASSERT_OK(uv_write(req, stream, bufs, nbufs, pinger_after_write));

  puts("PING");
}